

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTForeFlight.cpp
# Opt level: O2

void __thiscall
ForeFlightSender::SendAtt(ForeFlightSender *this,positionTy *pos,double param_2,double param_3)

{
  ssize_t sVar1;
  size_t in_RCX;
  undefined8 extraout_RDX;
  int in_R8D;
  _Rb_tree_node_base *p_Var2;
  undefined1 auVar3 [16];
  char s [200];
  char acStack_e8 [200];
  
  snprintf(acStack_e8,200,"XATTLiveTraffic,%.1f,%.1f,%.1f",pos->_head,pos->_pitch,pos->_roll);
  auVar3._8_8_ = extraout_RDX;
  auVar3._0_8_ = (this->mapUdp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var2 = auVar3._0_8_,
        (_Rb_tree_header *)p_Var2 != &(this->mapUdp)._M_t._M_impl.super__Rb_tree_header) {
    if (*(int *)&p_Var2[2]._M_parent != -1) {
      sVar1 = XPMP2::SocketNetworking::send
                        ((SocketNetworking *)(p_Var2 + 2),(int)acStack_e8,auVar3._8_8_,in_RCX,in_R8D
                        );
      if ((char)sVar1 == '\0') {
        XPMP2::SocketNetworking::Close((SocketNetworking *)(p_Var2 + 2));
      }
    }
    auVar3 = std::_Rb_tree_increment(p_Var2);
  }
  return;
}

Assistant:

void ForeFlightSender::SendAtt (const positionTy& pos, double /*speed_m*/, double /*track*/)
{
    // format the string to send
    char s[200];
    snprintf(s,sizeof(s),
             "XATTLiveTraffic,%.1f,%.1f,%.1f",
             pos.heading(),                     // heading
             pos.pitch(),                       // pitch
             pos.roll());                       // roll
    
    // send the string to all clients
    for (auto& p: mapUdp)
        if (p.second.isOpen() && !p.second.send(s))
            p.second.Close();
    // (no DebugLogRaw...not at 5Hz!)
}